

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O2

ssize_t nettlp_pcie_cfg_read(nettlp_pcie_cfg *ntpc,uint16_t addr,void *buf,size_t count)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  ushort uVar6;
  ulong uVar7;
  uint uVar8;
  undefined6 in_register_00000032;
  ushort uVar9;
  uint uVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  byte local_72;
  undefined1 local_71;
  uint local_70;
  int local_6c;
  int local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  uint32_t data;
  pollfd local_50;
  ulong local_48;
  ulong local_40;
  undefined8 local_38;
  
  uVar8 = (uint)CONCAT62(in_register_00000032,addr);
  uVar10 = (int)count + uVar8;
  local_5c = uVar10 & 3;
  local_68 = 4 - local_5c;
  uVar7 = CONCAT62(in_register_00000032,addr) >> 2 & 0x3fffffff;
  local_40 = (ulong)CONCAT22((ushort)(uVar10 >> 0x12),(short)(uVar10 >> 2) - (ushort)(local_5c == 0)
                            );
  uVar8 = uVar8 & 3;
  local_48 = (ulong)uVar8;
  local_6c = 4 - uVar8;
  local_60 = (uint)((byte)(0xf << (sbyte)uVar8) & 0xe);
  local_64 = 0xfU >> ((byte)local_68 & 0x1f) & 0xff;
  uVar11 = 0;
  iVar1 = 0;
  do {
    uVar6 = (ushort)uVar7;
    uVar9 = (ushort)local_40;
    if (uVar9 < uVar6) {
LAB_001039f0:
      return (long)iVar1;
    }
    bVar13 = local_48 != 0;
    bVar14 = local_5c == 0;
    bVar12 = (short)uVar11 == 0;
    uVar8 = 0xf;
    if (bVar12 && bVar13) {
      uVar8 = local_60;
    }
    uVar10 = local_64;
    if (uVar9 != uVar6 || bVar14) {
      uVar10 = 0xef;
    }
    local_72 = (byte)(uVar7 >> 8) & 3 | ((byte)uVar10 & (byte)uVar8) << 2;
    local_71 = (undefined1)uVar7;
    local_70 = 0;
    local_58 = iVar1;
    sVar2 = write(ntpc->sockfd,&local_72,6);
    iVar1 = (int)sVar2;
    if (iVar1 < 0) goto LAB_001039f0;
    local_50.fd = ntpc->sockfd;
    local_50.events = 1;
    local_38 = CONCAT62((int6)((ulong)uVar11 >> 0x10),(short)uVar11 + -1);
    iVar1 = poll(&local_50,1,1000);
    if (iVar1 < 0) goto LAB_001039f0;
    if (iVar1 == 0) {
      iVar1 = 0x3e;
LAB_001039e5:
      piVar4 = __errno_location();
      *piVar4 = iVar1;
      iVar1 = -1;
      goto LAB_001039f0;
    }
    if (((byte)local_50.revents & 1) == 0) {
      iVar1 = 0x3d;
      goto LAB_001039e5;
    }
    sVar2 = read(ntpc->sockfd,&local_72,6);
    uVar11 = local_38;
    iVar1 = (int)sVar2;
    if (iVar1 < 0) goto LAB_001039f0;
    data = local_70 >> 0x18 | (local_70 & 0xff0000) >> 8 | (local_70 & 0xff00) << 8 |
           local_70 << 0x18;
    uVar3 = 0;
    if (bVar12 && bVar13) {
      uVar3 = local_48;
    }
    iVar1 = 4;
    if (bVar12 && bVar13) {
      iVar1 = local_6c;
    }
    iVar5 = local_68;
    if (uVar9 != uVar6 || bVar14) {
      iVar5 = 0;
    }
    iVar1 = iVar1 - iVar5;
    memcpy(buf,(void *)((long)&data + uVar3),(long)iVar1);
    buf = (void *)((long)buf + (long)iVar1);
    iVar1 = iVar1 + local_58;
    uVar7 = (ulong)((int)uVar7 + 1);
  } while( true );
}

Assistant:

ssize_t nettlp_pcie_cfg_read(struct nettlp_pcie_cfg *ntpc, uint16_t addr,
			     void *buf, size_t count)
{
	int ret;
	uint16_t dwaddr;
	uint8_t mask;
	uint32_t data;
	uint8_t *ptr;

	int len, read = 0;
	uint16_t start_dwaddr, end_dwaddr;
	int fstpad;	/* unnecessary bytes in first DWORD */
	int lstpad;	/* unnecessary bytes in last DWORD */

	fstpad = addr & 0x0003;
	lstpad = 4 - ((addr + count) & 0x0003);

	start_dwaddr = addr >> 2;
	end_dwaddr = (addr + count) >> 2;
	/* A cornor case: If (addr + count) is a multple of 4, lastpad
	 * becomes 4, which means no need to read the end dword.
	 * Thus, decrement end_dwaddr and set lstpad 0.
	 */
	if (lstpad == 4) {
		lstpad = 0;
		end_dwaddr--;
	}

	for (dwaddr = start_dwaddr; dwaddr <= end_dwaddr; dwaddr++) {

		mask = 0xF;
		if (dwaddr == start_dwaddr && fstpad) {
			mask &= ((0x0F << fstpad) & 0x0F);
		}
		if (dwaddr == end_dwaddr && lstpad) {
			mask &= ((0x0F >> lstpad) & 0x0F);
		}

		ret = pcie_cfg_read_dw(ntpc, dwaddr, mask, &data);
		if (ret < 0)
			return ret;

		len = 4;
		ptr = (uint8_t *)&data;
		if (dwaddr == start_dwaddr && fstpad) {
			len -= fstpad;
			ptr += fstpad;
		}
		if (dwaddr == end_dwaddr && lstpad) {
			len -= lstpad;
		}

		memcpy(buf, ptr, len);
		buf += len;
		read += len;
	}

	return read;
}